

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

int If_DsdManAddDsd(If_DsdMan_t *p,char *pDsd,word *pTruth,uchar *pPerm,int *pnSupp)

{
  char cVar1;
  long lVar2;
  int iVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  bool bVar7;
  char *pDsd_local;
  int aiStack_1f98 [12];
  int pMatches [2000];
  
  bVar4 = *pDsd;
  bVar7 = bVar4 == 0x21;
  pDsd_local = pDsd;
  if (bVar7) {
    pDsd_local = pDsd + 1;
    bVar4 = pDsd[1];
  }
  if (bVar4 == 0x31) {
    if (pDsd_local[1] == '\0') {
      iVar3 = 1;
      goto LAB_00385a53;
    }
  }
  else if ((bVar4 == 0x30) && (pDsd_local[1] == '\0')) {
    iVar3 = 0;
    goto LAB_00385a53;
  }
  cVar1 = pDsd_local[bVar4 == 0x21];
  if ((byte)(cVar1 + 0x85U) < 0xe6) {
    lVar5 = 0;
    iVar3 = 0;
    while (bVar4 != 0) {
      pMatches[lVar5] = 0;
      uVar6 = bVar4 - 0x28;
      if (uVar6 < 0x36) {
        if ((0x8000000100001U >> ((ulong)uVar6 & 0x3f) & 1) != 0) goto LAB_00385a03;
        if ((0x20000000400002U >> ((ulong)uVar6 & 0x3f) & 1) == 0) goto LAB_003859e9;
LAB_003859f5:
        pMatches[aiStack_1f98[(long)iVar3 + -1]] = (int)lVar5;
        iVar3 = iVar3 + -1;
      }
      else {
LAB_003859e9:
        if (bVar4 == 0x7b) {
LAB_00385a03:
          pMatches[(long)iVar3 + -0xc] = (int)lVar5;
          if (10 < iVar3) {
            __assert_fail("nNested < DAU_MAX_VAR",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                          ,0x67d,"void If_DsdMergeMatches(char *, int *)");
          }
          iVar3 = iVar3 + 1;
        }
        else if (bVar4 == 0x7d) goto LAB_003859f5;
      }
      lVar2 = lVar5 + 1;
      lVar5 = lVar5 + 1;
      bVar4 = pDsd_local[lVar2];
    }
    if (iVar3 != 0) {
      __assert_fail("nNested == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x67f,"void If_DsdMergeMatches(char *, int *)");
    }
    iVar3 = If_DsdManAddDsd_rec(pDsd_local,&pDsd_local,pMatches,p,pTruth,pPerm,pnSupp);
  }
  else {
    iVar3 = *pnSupp;
    *pnSupp = iVar3 + 1;
    pPerm[iVar3] = cVar1 + 0x9f;
    iVar3 = 2;
  }
LAB_00385a53:
  iVar3 = Abc_LitNotCond(iVar3,(uint)bVar7);
  return iVar3;
}

Assistant:

int If_DsdManAddDsd( If_DsdMan_t * p, char * pDsd, word * pTruth, unsigned char * pPerm, int * pnSupp )
{
    int iRes = -1, fCompl = 0;
    if ( *pDsd == '!' )
         pDsd++, fCompl = 1;
    if ( Dau_DsdIsConst0(pDsd) )
        iRes = 0;
    else if ( Dau_DsdIsConst1(pDsd) )
        iRes = 1;
    else if ( Dau_DsdIsVar(pDsd) )
    {
        pPerm[(*pnSupp)++] = Dau_DsdReadVar(pDsd);
        iRes = 2;
    }
    else
    {
        int pMatches[DAU_MAX_STR];
        If_DsdMergeMatches( pDsd, pMatches );
        iRes = If_DsdManAddDsd_rec( pDsd, &pDsd, pMatches, p, pTruth, pPerm, pnSupp );
    }
    return Abc_LitNotCond( iRes, fCompl );
}